

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O1

void __thiscall cppwinrt::writer::add_depends(writer *this,TypeDef *type)

{
  table_base *this_00;
  database *this_01;
  uint index;
  int iVar1;
  size_t __n;
  _Rb_tree<winmd::reader::TypeDef,winmd::reader::TypeDef,std::_Identity<winmd::reader::TypeDef>,cppwinrt::writer::depends_compare,std::allocator<winmd::reader::TypeDef>>
  *this_02;
  string_view ns;
  string_view local_28;
  
  this_00 = (type->super_row_base<winmd::reader::TypeDef>).m_table;
  this_01 = this_00->m_database;
  index = winmd::reader::table_base::get_value<unsigned_int>
                    (this_00,(type->super_row_base<winmd::reader::TypeDef>).m_index,2);
  local_28 = winmd::reader::database::get_string(this_01,index);
  __n = local_28._M_len;
  if (__n == (this->type_namespace)._M_string_length) {
    if (__n == 0) {
      return;
    }
    iVar1 = bcmp(local_28._M_str,(this->type_namespace)._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return;
    }
  }
  this_02 = (_Rb_tree<winmd::reader::TypeDef,winmd::reader::TypeDef,std::_Identity<winmd::reader::TypeDef>,cppwinrt::writer::depends_compare,std::allocator<winmd::reader::TypeDef>>
             *)std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
               ::operator[](&this->depends,&local_28);
  std::
  _Rb_tree<winmd::reader::TypeDef,winmd::reader::TypeDef,std::_Identity<winmd::reader::TypeDef>,cppwinrt::writer::depends_compare,std::allocator<winmd::reader::TypeDef>>
  ::_M_insert_unique<winmd::reader::TypeDef_const&>(this_02,type);
  return;
}

Assistant:

void add_depends(TypeDef const& type)
        {
            auto ns = type.TypeNamespace();

            if (ns != type_namespace)
            {
                depends[ns].insert(type);
            }
        }